

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O1

void ImGui::Dummy(ImVec2 *size)

{
  ImGuiWindow_conflict *pIVar1;
  ImRect bb;
  ImRect local_18;
  
  pIVar1 = GImGui->CurrentWindow;
  pIVar1->WriteAccessed = true;
  if (pIVar1->SkipItems == false) {
    local_18.Min = (pIVar1->DC).CursorPos;
    local_18.Max.y = (pIVar1->DC).CursorPos.y + size->y;
    local_18.Max.x = (pIVar1->DC).CursorPos.x + size->x;
    ItemSize(size,-1.0);
    ItemAdd(&local_18,0,(ImRect *)0x0,0);
  }
  return;
}

Assistant:

inline    ImGuiWindow*  GetCurrentWindow()          { ImGuiContext& g = *GImGui; g.CurrentWindow->WriteAccessed = true; return g.CurrentWindow; }